

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  long *plVar1;
  int iVar2;
  undefined8 *puVar3;
  thread *ptVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined4 in_register_0000003c;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char _C;
  string main_folder;
  string key;
  string fpath;
  string f;
  ofstream ofile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined8 local_2f0;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ulong local_288;
  char **local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  string local_250;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_2f0 = CONCAT44(in_register_0000003c,argc);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)__s);
LAB_001032f1:
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Input] Enter key(max 16 symbols): ",0x23);
    std::operator>>((istream *)&std::cin,(string *)&local_2c8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    local_270 = &local_260;
    local_268 = 0;
    local_260 = 0;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_230,*argv,(allocator *)&local_310);
    getFileName(&local_250,(string *)local_230,&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,local_2e8._M_dataplus._M_p,
               local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
    std::__cxx11::string::append((char *)&local_310);
    std::ofstream::ofstream(local_230,(string *)&local_310,_S_out|_S_app);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Output] Logging into: ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encoder.log",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    if ((int)local_2f0 < 2) {
      puVar3 = (undefined8 *)operator_new__(8);
      ptVar4 = (thread *)operator_new(8);
      local_310._M_dataplus._M_p = local_230;
      std::thread::
      thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                (ptVar4,encodeFile,&local_2a8,&local_2c8,
                 (basic_ofstream<char,_std::char_traits<char>_> **)&local_310);
      *puVar3 = ptVar4;
      std::thread::join();
    }
    else {
      uVar6 = (int)local_2f0 - 1;
      local_280 = argv;
      puVar3 = (undefined8 *)operator_new__((ulong)uVar6 * 8);
      uVar7 = 0;
      local_288 = (ulong)uVar6;
      do {
        std::__cxx11::string::string
                  ((string *)&local_310,local_280[uVar7 + 1],(allocator *)&local_278);
        ptVar4 = (thread *)operator_new(8);
        local_278 = local_230;
        std::thread::
        thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                  (ptVar4,encodeFile,&local_310,&local_2c8,
                   (basic_ofstream<char,_std::char_traits<char>_> **)&local_278);
        puVar3[uVar7] = ptVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      uVar7 = 1;
      if (1 < (int)local_288) {
        uVar7 = local_288 & 0xffffffff;
      }
      uVar8 = 0;
      do {
        std::thread::join();
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    iVar2 = (int)local_2f0 + -1;
    if (iVar2 != 0) {
      lVar9 = 0;
      do {
        plVar1 = (long *)puVar3[lVar9];
        if (plVar1 != (long *)0x0) {
          if (*plVar1 != 0) {
            std::terminate();
          }
          operator_delete(plVar1,8);
        }
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
    operator_delete__(puVar3);
    std::ofstream::close();
    std::operator>>((istream *)&std::cin,(char *)&local_310);
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                               local_2a8.field_2._M_local_buf[0]) + 1);
    }
    return 0;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Output] You can open file(s) with this program",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)&mu);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Output] Or drag\'n\'drop on it",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      pthread_mutex_unlock((pthread_mutex_t *)&mu);
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mu);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Input] Enter filename(without spaces): ",0x28);
        pthread_mutex_unlock((pthread_mutex_t *)&mu);
        std::operator>>((istream *)&std::cin,(string *)&local_2a8);
        goto LAB_001032f1;
      }
    }
  }
  uVar5 = std::__throw_system_error(iVar2);
  operator_delete(argv,8);
  std::ofstream::~ofstream(local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                             local_2e8.field_2._M_local_buf[0]) + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

int main(const int argc, const char* argv[]) {
    //path
    std::string fpath;
    if (argc>1) {
        fpath.assign(argv[1]);
    } else {
        mu.lock(); std::cout << "[Output] You can open file(s) with this program" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Output] Or drag'n'drop on it" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Input] Enter filename(without spaces): "; mu.unlock();
        std::cin >> fpath;
    }

    //key reader
    std::string key;
    std::cout << "[Input] Enter key(max 16 symbols): ";
    std::cin >> key;
    std::cout << std::endl;

    std::string f, main_folder;
    getFileName(argv[0], &main_folder);
    std::ofstream ofile(main_folder+LOG_FILENAME, std::ios::out | std::ios::app);
    std::cout << "[Output] Logging into: " << LOG_FILENAME << std::endl;

    std::thread** threads;
    if (argc>1) {
        threads = new std::thread*[argc-1];
        for (int i=0; i<argc-1; i++) {
            std::string tfpath(argv[i+1]);
            std::thread* t  = new std::thread(encodeFile, tfpath, key, &ofile);
            threads[i] = t;
        }
        for (int i=0; i<argc-1; i++) {
            threads[i]->join();
        }
    } else {
        threads = new std::thread*[1];
        std::thread* t = new std::thread(encodeFile, fpath, key, &ofile);
        threads[0] = t;
        t->join();
    }

    for (size_t i=0; i<argc-1; i++) {
        delete threads[i];
    }
    delete[] threads;

    ofile.close();
    char _C; std::cin >> _C;            //breakpoint
    return 0;
}